

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall
jsonnet::internal::DesugaredObject::DesugaredObject
          (DesugaredObject *this,LocationRange *lr,ASTs *asserts,Fields *fields)

{
  list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *in_RCX;
  vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
  *in_RDX;
  vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
  *in_RSI;
  undefined8 *in_RDI;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *this_00;
  Fodder *in_stack_ffffffffffffffb8;
  ASTType in_stack_ffffffffffffffc4;
  LocationRange *location;
  AST *this_01;
  pointer __x;
  
  location = (LocationRange *)0x0;
  this_01 = (AST *)0x0;
  __x = (pointer)0x0;
  this_00 = (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             *)&stack0xffffffffffffffc8;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)0x2b901c);
  AST::AST(this_01,location,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector(this_00);
  *in_RDI = &PTR__DesugaredObject_003aa3c0;
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::list
            (in_RCX,(list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)__x
            );
  std::
  vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
  ::vector(in_RSI,in_RDX);
  return;
}

Assistant:

DesugaredObject(const LocationRange &lr, const ASTs &asserts, const Fields &fields)
        : AST(lr, AST_DESUGARED_OBJECT, Fodder{}), asserts(asserts), fields(fields)
    {
    }